

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Bac_NtkTransformToPtrBox(Bac_Ntk_t *p,int iBox)

{
  long lVar1;
  Bac_Man_t *pBVar2;
  Mio_Library_t *pLib;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  byte local_64;
  Bac_Ntk_t *local_60;
  Mio_Gate_t *local_58;
  
  if (-1 < iBox) {
    uVar11 = (ulong)(uint)iBox;
    uVar10 = (p->vType).nSize;
    if (iBox < (int)uVar10) {
      local_64 = (p->vType).pArray[uVar11];
      if ((local_64 >> 1) - 0x49 < 0xffffffbc) {
        __assert_fail("Bac_ObjIsBox(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
      }
      if (iBox < (p->vFanin).nSize) {
        pBVar2 = p->pDesign;
        iVar7 = (p->vFanin).pArray[uVar11];
        if (((long)iVar7 < 1) || (pBVar2->nNtks < iVar7)) {
          local_60 = (Bac_Ntk_t *)0x0;
        }
        else {
          local_60 = pBVar2->pNtks + iVar7;
        }
        pLib = (Mio_Library_t *)pBVar2->pMioLib;
        if (pLib == (Mio_Library_t *)0x0) {
          local_58 = (Mio_Gate_t *)0x0;
        }
        else {
          pcVar3 = Abc_NamStr(pBVar2->pMods,iVar7);
          local_58 = Mio_LibraryReadGateByName(pLib,pcVar3,(char *)0x0);
          uVar10 = (p->vType).nSize;
        }
        if ((int)uVar10 <= iBox) goto LAB_00395c10;
        pcVar3 = (p->vType).pArray;
        if (((byte)pcVar3[uVar11] >> 1) - 0x49 < 0xffffffbc) {
          __assert_fail("Bac_ObjIsBox(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x130,"int Bac_BoxBiNum(Bac_Ntk_t *, int)");
        }
        local_64 = local_64 & 0xfe;
        uVar9 = iBox - 1;
        uVar8 = uVar11;
        do {
          if ((long)uVar8 < 1) {
            iVar7 = 1;
            goto LAB_0039574c;
          }
          if (uVar10 <= uVar9) goto LAB_00395c10;
          lVar12 = uVar8 - 1;
          uVar8 = uVar8 - 1;
        } while ((pcVar3[lVar12] & 0xfeU) == 6);
        iVar7 = -(int)uVar8;
LAB_0039574c:
        uVar8 = uVar11;
        do {
          uVar8 = uVar8 + 1;
          uVar13 = uVar10 - 1;
          if (uVar10 <= uVar8) break;
          uVar9 = uVar9 + 1;
          uVar13 = uVar9;
        } while ((pcVar3[uVar8] & 0xfeU) == 8);
        iVar7 = uVar13 + iVar7;
        if (iVar7 < 0) {
          __assert_fail("nCap >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
        }
        uVar10 = iVar7 * 2;
        uVar8 = (ulong)uVar10;
        pVVar4 = (Vec_Ptr_t *)malloc(0x10);
        pVVar4->nSize = 0;
        pVVar4->nCap = uVar10;
        if (iVar7 == 0) {
          ppvVar5 = (void **)0x0;
        }
        else {
          ppvVar5 = (void **)malloc((ulong)uVar10 << 3);
        }
        pVVar4->pArray = ppvVar5;
        if (iBox < (p->vFanin).nSize) {
          pcVar3 = Abc_NamStr(p->pDesign->pMods,(p->vFanin).pArray[uVar11]);
          if (iVar7 == 0) {
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,0x80);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = 0x10;
            uVar8 = 0x10;
          }
          *ppvVar5 = pcVar3;
          pcVar3 = Bac_ObjNameStr(p,iBox);
          pVVar4->nSize = 2;
          pVVar4->pArray[1] = pcVar3;
          if (iBox == 0) {
            uVar11 = 2;
            uVar10 = 1;
          }
          else {
            uVar10 = iBox + 1;
            lVar12 = uVar11 * 2;
            lVar16 = 0;
            lVar15 = 0;
            do {
              if ((p->vType).nSize < (int)uVar11) goto LAB_00395c10;
              uVar11 = uVar11 - 1;
              uVar9 = (uint)lVar15;
              uVar13 = uVar9;
              if (((p->vType).pArray[uVar11 & 0xffffffff] & 0xfeU) != 6) break;
              if (local_64 == 10) {
                if ((local_60->vInputs).nSize <= lVar16) goto LAB_00395c2f;
                pcVar3 = Bac_ObjNameStr(local_60,*(int *)((long)(local_60->vInputs).pArray +
                                                         lVar15 * 2));
              }
              else {
                pcVar3 = Mio_GateReadPinName(local_58,(int)lVar16);
              }
              lVar1 = lVar15 + 2;
              uVar13 = (uint)lVar1;
              uVar6 = (uint)uVar8;
              if (uVar13 == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = 0x10;
                  uVar8 = 0x10;
                }
                else {
                  uVar8 = (ulong)(uVar6 * 2);
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(uVar8 * 8);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,uVar8 * 8);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = uVar6 * 2;
                }
              }
              else {
                ppvVar5 = pVVar4->pArray;
              }
              ppvVar5[lVar15 + 2] = pcVar3;
              pcVar3 = Bac_ObjNameStr(p,(int)uVar11);
              if (uVar9 + 3 == (int)uVar8) {
                if (uVar13 < 0xf) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = 0x10;
                  uVar8 = 0x10;
                }
                else {
                  uVar6 = (int)uVar8 * 2;
                  uVar8 = (ulong)uVar6;
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(uVar8 * 8);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,uVar8 * 8);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = uVar6;
                }
              }
              else {
                ppvVar5 = pVVar4->pArray;
              }
              pVVar4->nSize = uVar9 + 4;
              ppvVar5[lVar15 + 3] = pcVar3;
              lVar16 = lVar16 + 1;
              lVar15 = lVar1;
            } while (lVar12 != lVar1);
            uVar11 = (ulong)(uVar13 + 2);
          }
          iVar7 = (int)uVar8;
          if ((int)uVar10 < (p->vType).nSize) {
            uVar11 = (ulong)(int)uVar11;
            lVar12 = 0;
            do {
              iVar7 = (int)uVar8;
              if (iBox + (int)lVar12 < -1) goto LAB_00395c10;
              if (((p->vType).pArray[lVar12 + (ulong)uVar10] & 0xfeU) != 8) break;
              if (local_64 == 10) {
                if ((local_60->vOutputs).nSize <= lVar12) goto LAB_00395c2f;
                pcVar3 = Bac_ObjNameStr(local_60,(local_60->vOutputs).pArray[lVar12]);
              }
              else {
                pcVar3 = Mio_GateReadOutName(local_58);
              }
              iVar14 = (int)uVar11;
              if (iVar14 == iVar7) {
                if (iVar7 < 0x10) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = 0x10;
                  uVar8 = 0x10;
                }
                else {
                  uVar8 = (ulong)(uint)(iVar7 * 2);
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(uVar8 * 8);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,uVar8 * 8);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = iVar7 * 2;
                }
              }
              else {
                ppvVar5 = pVVar4->pArray;
              }
              ppvVar5[uVar11] = pcVar3;
              pcVar3 = Bac_ObjNameStr(p,uVar10 + (int)lVar12);
              if (iVar14 + 1 == (int)uVar8) {
                if (iVar14 < 0xf) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = 0x10;
                  uVar8 = 0x10;
                }
                else {
                  uVar9 = (int)uVar8 * 2;
                  uVar8 = (ulong)uVar9;
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(uVar8 * 8);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar4->pArray,uVar8 * 8);
                  }
                  pVVar4->pArray = ppvVar5;
                  pVVar4->nCap = uVar9;
                }
              }
              else {
                ppvVar5 = pVVar4->pArray;
              }
              iVar7 = (int)uVar8;
              uVar11 = uVar11 + 2;
              pVVar4->nSize = (int)uVar11;
              ppvVar5[iVar14 + 1] = pcVar3;
              lVar12 = lVar12 + 1;
            } while ((int)(uVar10 + (int)lVar12) < (p->vType).nSize);
          }
          if ((int)uVar11 != iVar7) {
            __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                          ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
          }
          return pVVar4;
        }
      }
LAB_00395c2f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
LAB_00395c10:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBox( Bac_Ntk_t * p, int iBox )
{
    int i, iTerm, fUser = Bac_ObjIsBoxUser( p, iBox );
    Bac_Ntk_t * pBoxNtk = Bac_BoxNtk( p, iBox );
    Mio_Library_t * pLib = (Mio_Library_t *)p->pDesign->pMioLib;
    Mio_Gate_t * pGate = pLib ? Mio_LibraryReadGateByName( pLib, Bac_BoxNtkName(p, iBox), NULL ) : NULL;
    Vec_Ptr_t * vBox = Vec_PtrAllocExact( 2*Bac_BoxSize(p, iBox) );
    Vec_PtrPush( vBox, Bac_BoxNtkName(p, iBox) );
    Vec_PtrPush( vBox, Bac_ObjNameStr(p, iBox) );
    Bac_BoxForEachBi( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPi(pBoxNtk, i)) : Mio_GateReadPinName(pGate, i) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    Bac_BoxForEachBo( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPo(pBoxNtk, i)) : Mio_GateReadOutName(pGate) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    assert( Ptr_CheckArray(vBox) );
    return vBox;
}